

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.cpp
# Opt level: O2

void sf2cute::RIFFListChunk::WriteHeader(ostream *out,string *name,size_type size)

{
  ostream *poVar1;
  length_error *this;
  string asStack_1b8 [32];
  ostringstream message_builder;
  
  if (size >> 0x20 == 0) {
    std::ios::exceptions((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
    std::ostream::write((char *)out,0x1124a7);
    InsertInt32L<std::ostream>(out,(uint32_t)size);
    std::ostream::write((char *)out,(long)(name->_M_dataplus)._M_p);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message_builder);
  poVar1 = std::operator<<((ostream *)&message_builder,"RIFF chunk \"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\" size too large.");
  this = (length_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::length_error::length_error(this,asStack_1b8);
  __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void RIFFListChunk::WriteHeader(std::ostream & out,
    const std::string & name,
    size_type size) {
  // Throw exception if the chunk size exceeds the maximum.
  if (size > UINT32_MAX) {
    std::ostringstream message_builder;
    message_builder << "RIFF chunk \"" << name << "\" size too large.";
    throw std::length_error(message_builder.str());
  }

  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk ID "LIST".
    out.write("LIST", 4);

    // Write the chunk size.
    InsertInt32L(out, static_cast<uint32_t>(size));

    // Write the list type.
    out.write(name.data(), name.size());
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}